

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O0

void HandleInstruction(char *opcode,uint arg_count,char **arg_array)

{
  int iVar1;
  long *__ptr;
  long lVar2;
  long value;
  uint local_30;
  uint i_2;
  uint i_1;
  uint i;
  long *int_arg_array;
  char **arg_array_local;
  uint arg_count_local;
  char *opcode_local;
  
  __ptr = (long *)malloc((ulong)arg_count << 3);
  if (__ptr == (long *)0x0) {
    PrintError("Error: malloc failed. Great.");
  }
  else {
    for (i_2 = 0; i_2 < arg_count; i_2 = i_2 + 1) {
      lVar2 = LookupDictionary(arg_array[i_2]);
      __ptr[i_2] = lVar2;
    }
    for (local_30 = 0; local_30 < 0x4d; local_30 = local_30 + 1) {
      iVar1 = strcmp(opcode,symbol_function_table[local_30].symbol);
      if (iVar1 == 0) {
        (*symbol_function_table[local_30].function)(arg_count,__ptr);
        free(__ptr);
        return;
      }
    }
    iVar1 = strcmp(opcode,"dc.b");
    if (iVar1 == 0) {
      for (value._4_4_ = 0; value._4_4_ < arg_count; value._4_4_ = value._4_4_ + 1) {
        lVar2 = __ptr[value._4_4_];
        if (0xff < lVar2) {
          PrintError("Error: dc.b value must fit into a byte\n");
        }
        WriteByte((uchar)lVar2);
      }
    }
    else {
      PrintError("Error: Unhandled instruction: \'%s\'\n",opcode);
    }
    free(__ptr);
  }
  return;
}

Assistant:

void HandleInstruction(char *opcode, unsigned int arg_count, char *arg_array[])
{
	long *int_arg_array = malloc(sizeof(long) * arg_count);
	if (int_arg_array == NULL)
	{
		PrintError("Error: malloc failed. Great.");
		return;
	}

	// Convert arguments from symbols to numbers (*everything* resolves to a number eventually - code, labels, constants, etc.)
	for (unsigned int i = 0; i < arg_count; ++i)
		int_arg_array[i] = LookupDictionary(arg_array[i]);

	// Execute the function that matches the instruction
	for (unsigned int i = 0; i < sizeof(symbol_function_table) / sizeof(symbol_function_table[0]); ++i)
	{
		if (strcmp(opcode, symbol_function_table[i].symbol) == 0)
		{
			symbol_function_table[i].function(arg_count, int_arg_array);
			free(int_arg_array);
			return;
		}
	}

	// If the instruction doesn't match any of the SMPS2ASM macros, check if it's the 68k's 'dc.b' instruction
	if (strcmp(opcode, "dc.b") == 0)
	{
		for (unsigned int i = 0; i < arg_count; ++i)
		{
			const long value = int_arg_array[i];

			if (value > 0xFF)
				PrintError("Error: dc.b value must fit into a byte\n");

			WriteByte(value);
		}
	}
	else
	{
		// Oh no
		PrintError("Error: Unhandled instruction: '%s'\n", opcode);
	}

	free(int_arg_array);
}